

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O0

void __thiscall
CBlockPolicyEstimator::CBlockPolicyEstimator
          (CBlockPolicyEstimator *this,path *estimation_filepath,bool read_stale_estimates)

{
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  bool bVar1;
  strong_ordering sVar2;
  mapped_type_conflict2 mVar3;
  ConstevalFormatString<1U> fmt;
  TxConfirmStats *this_00;
  TxConfirmStats *pTVar4;
  vector<double,_std::allocator<double>_> *defaultBuckets;
  map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
  *defaultBucketMap;
  void *_decay;
  FILE *pFVar5;
  hours args_2;
  byte in_DL;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  size_t bucketIndex;
  hours file_age;
  double bucketBoundary;
  AutoFile est_file;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  path *in_stack_fffffffffffffd40;
  duration<long,_std::ratio<3600L,_1L>_> in_stack_fffffffffffffd48;
  duration<long,_std::ratio<3600L,_1L>_> *in_stack_fffffffffffffd50;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd58;
  map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
  *in_stack_fffffffffffffd60;
  vector<std::byte,_std::allocator<std::byte>_> *in_stack_fffffffffffffd70;
  FILE *in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  undefined1 *flag;
  int source_line;
  undefined8 in_stack_fffffffffffffdb0;
  uint uVar6;
  double in_stack_fffffffffffffdb8;
  undefined8 in_stack_fffffffffffffdc0;
  uint uVar7;
  map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
  *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdf0;
  mapped_type_conflict2 in_stack_fffffffffffffdf4;
  mapped_type_conflict2 *in_stack_fffffffffffffdf8;
  undefined8 *puVar8;
  char *pcVar9;
  AutoFile *filein;
  CBlockPolicyEstimator *this_01;
  Level in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  long *in_stack_fffffffffffffef8;
  undefined1 local_b8 [8];
  undefined1 local_b0 [8];
  undefined1 local_a8 [8];
  double local_a0;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CValidationInterface::CValidationInterface
            ((CValidationInterface *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  *in_RDI = &PTR_UpdatedBlockTip_01612820;
  puVar8 = in_RDI + 1;
  fs::path::path((path *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                 (path *)0x4f119b);
  pcVar9 = (char *)(in_RDI + 6);
  AnnotatedMixin<std::mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::mutex> *)
             CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  *(undefined4 *)(in_RDI + 0xb) = 0;
  *(undefined4 *)((long)in_RDI + 0x5c) = 0;
  *(undefined4 *)(in_RDI + 0xc) = 0;
  *(undefined4 *)((long)in_RDI + 100) = 0;
  std::
  map<uint256,_CBlockPolicyEstimator::TxStatsInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
  ::map((map<uint256,_CBlockPolicyEstimator::TxStatsInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
         *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  std::unique_ptr<TxConfirmStats,std::default_delete<TxConfirmStats>>::
  unique_ptr<std::default_delete<TxConfirmStats>,void>
            ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
             CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  filein = (AutoFile *)(in_RDI + 0x14);
  std::unique_ptr<TxConfirmStats,std::default_delete<TxConfirmStats>>::
  unique_ptr<std::default_delete<TxConfirmStats>,void>
            ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
             CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  this_01 = (CBlockPolicyEstimator *)(in_RDI + 0x15);
  std::unique_ptr<TxConfirmStats,std::default_delete<TxConfirmStats>>::
  unique_ptr<std::default_delete<TxConfirmStats>,void>
            ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
             CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  *(undefined4 *)(in_RDI + 0x16) = 0;
  *(undefined4 *)((long)in_RDI + 0xb4) = 0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  std::
  map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
  ::map((map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
         *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  mVar3 = 0;
  local_a0 = 1000.0;
  while( true ) {
    uVar6 = (uint)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
    uVar7 = (uint)((ulong)in_stack_fffffffffffffdc0 >> 0x20);
    if (10000000.0 < local_a0) break;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd48.__r,
               (value_type_conflict7 *)in_stack_fffffffffffffd40);
    in_stack_fffffffffffffdf4 = mVar3;
    in_stack_fffffffffffffdf8 =
         std::
         map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
         ::operator[](in_stack_fffffffffffffd60,(key_type_conflict3 *)in_stack_fffffffffffffd58);
    *in_stack_fffffffffffffdf8 = in_stack_fffffffffffffdf4;
    local_a0 = local_a0 * 1.05;
    mVar3 = mVar3 + 1;
  }
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd48.__r,
             (value_type_conflict7 *)in_stack_fffffffffffffd40);
  fmt.fmt = (char *)std::
                    map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
                    ::operator[](in_stack_fffffffffffffd60,
                                 (key_type_conflict3 *)in_stack_fffffffffffffd58);
  *(mapped_type_conflict2 *)fmt.fmt = mVar3;
  this_00 = (TxConfirmStats *)
            std::
            map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
            ::size((map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
                    *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  pTVar4 = (TxConfirmStats *)
           std::vector<double,_std::allocator<double>_>::size
                     ((vector<double,_std::allocator<double>_> *)
                      CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  if (this_00 != pTVar4) {
    __assert_fail("bucketMap.size() == buckets.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
                  ,0x227,
                  "CBlockPolicyEstimator::CBlockPolicyEstimator(const fs::path &, const bool)");
  }
  defaultBuckets = (vector<double,_std::allocator<double>_> *)operator_new(0xb0);
  TxConfirmStats::TxConfirmStats
            (this_00,defaultBuckets,in_stack_fffffffffffffdc8,uVar7,in_stack_fffffffffffffdb8,uVar6)
  ;
  uVar7 = (uint)((ulong)local_a8 >> 0x20);
  std::unique_ptr<TxConfirmStats,std::default_delete<TxConfirmStats>>::
  unique_ptr<std::default_delete<TxConfirmStats>,void>
            ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
             CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),(pointer)0x4f149e);
  std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator=
            ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
             in_stack_fffffffffffffd48.__r,
             (unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
             in_stack_fffffffffffffd40);
  std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::~unique_ptr
            ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
             in_stack_fffffffffffffd48.__r);
  defaultBucketMap =
       (map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
        *)operator_new(0xb0);
  TxConfirmStats::TxConfirmStats
            (this_00,defaultBuckets,defaultBucketMap,uVar7,in_stack_fffffffffffffdb8,uVar6);
  uVar6 = (uint)((ulong)local_b0 >> 0x20);
  std::unique_ptr<TxConfirmStats,std::default_delete<TxConfirmStats>>::
  unique_ptr<std::default_delete<TxConfirmStats>,void>
            ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
             CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),(pointer)0x4f1530);
  std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator=
            ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
             in_stack_fffffffffffffd48.__r,
             (unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
             in_stack_fffffffffffffd40);
  std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::~unique_ptr
            ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
             in_stack_fffffffffffffd48.__r);
  _decay = operator_new(0xb0);
  TxConfirmStats::TxConfirmStats(this_00,defaultBuckets,defaultBucketMap,uVar7,(double)_decay,uVar6)
  ;
  flag = local_b8;
  std::unique_ptr<TxConfirmStats,std::default_delete<TxConfirmStats>>::
  unique_ptr<std::default_delete<TxConfirmStats>,void>
            ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
             CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),(pointer)0x4f15bc);
  std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator=
            ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
             in_stack_fffffffffffffd48.__r,
             (unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
             in_stack_fffffffffffffd40);
  std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::~unique_ptr
            ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
             in_stack_fffffffffffffd48.__r);
  pFVar5 = fsbridge::fopen((char *)(in_RDI + 1),"rb");
  source_line = (int)((ulong)pFVar5 >> 0x20);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)
             CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  AutoFile::AutoFile((AutoFile *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                     in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffd48.__r);
  bVar1 = AutoFile::IsNull((AutoFile *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38)
                          );
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffd58,(char *)in_stack_fffffffffffffd50);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffd58,(char *)in_stack_fffffffffffffd50);
    fs::PathToString_abi_cxx11_(in_stack_fffffffffffffd40);
    in_stack_fffffffffffffd38 = 2;
    logging_function._M_str = pcVar9;
    logging_function._M_len = (size_t)puVar8;
    source_file._M_len._4_4_ = in_stack_fffffffffffffdf4;
    source_file._M_len._0_4_ = in_stack_fffffffffffffdf0;
    source_file._M_str = (char *)in_stack_fffffffffffffdf8;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function,source_file,source_line,(LogFlags)flag,in_stack_fffffffffffffee0,fmt
               ,in_stack_fffffffffffffef0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  }
  else {
    args_2 = GetFeeEstimatorFileAge
                       ((CBlockPolicyEstimator *)
                        CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    sVar2 = std::chrono::operator<=><long,_std::ratio<3600L,_1L>,_long,_std::ratio<3600L,_1L>_>
                      (in_stack_fffffffffffffd50,
                       (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_fffffffffffffd48.__r);
    std::__cmp_cat::__unspec::__unspec
              ((__unspec *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
               (__unspec *)0x4f1886);
    bVar1 = std::operator>(sVar2._M_value);
    if ((bVar1) && ((in_DL & 1) == 0)) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffd58,(char *)in_stack_fffffffffffffd50);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffd58,(char *)in_stack_fffffffffffffd50);
      fs::PathToString_abi_cxx11_(in_stack_fffffffffffffd40);
      Ticks<std::chrono::duration<long,std::ratio<3600l,1l>>,std::chrono::duration<long,std::ratio<3600l,1l>>>
                (in_stack_fffffffffffffd48);
      Ticks<std::chrono::duration<long,std::ratio<3600l,1l>>,std::chrono::duration<long,std::ratio<3600l,1l>>>
                (in_stack_fffffffffffffd48);
      in_stack_fffffffffffffd38 = 2;
      logging_function_00._M_str = pcVar9;
      logging_function_00._M_len = (size_t)puVar8;
      source_file_00._M_len._4_4_ = in_stack_fffffffffffffdf4;
      source_file_00._M_len._0_4_ = in_stack_fffffffffffffdf0;
      source_file_00._M_str = (char *)in_stack_fffffffffffffdf8;
      LogPrintFormatInternal<std::__cxx11::string,long,long>
                (logging_function_00,source_file_00,source_line,(LogFlags)flag,
                 in_stack_fffffffffffffee0,(ConstevalFormatString<3U>)fmt.fmt,
                 in_stack_fffffffffffffef0,in_stack_fffffffffffffef8,(long *)args_2.__r);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    }
    else {
      bVar1 = Read(this_01,filein);
      if (!bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffd58,(char *)in_stack_fffffffffffffd50);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffd58,(char *)in_stack_fffffffffffffd50);
        fs::PathToString_abi_cxx11_(in_stack_fffffffffffffd40);
        in_stack_fffffffffffffd38 = 2;
        logging_function_01._M_str = pcVar9;
        logging_function_01._M_len = (size_t)puVar8;
        source_file_01._M_len._4_4_ = in_stack_fffffffffffffdf4;
        source_file_01._M_len._0_4_ = in_stack_fffffffffffffdf0;
        source_file_01._M_str = (char *)in_stack_fffffffffffffdf8;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function_01,source_file_01,source_line,(LogFlags)flag,
                   in_stack_fffffffffffffee0,fmt,in_stack_fffffffffffffef0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      }
    }
  }
  AutoFile::~AutoFile((AutoFile *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

CBlockPolicyEstimator::CBlockPolicyEstimator(const fs::path& estimation_filepath, const bool read_stale_estimates)
    : m_estimation_filepath{estimation_filepath}
{
    static_assert(MIN_BUCKET_FEERATE > 0, "Min feerate must be nonzero");
    size_t bucketIndex = 0;

    for (double bucketBoundary = MIN_BUCKET_FEERATE; bucketBoundary <= MAX_BUCKET_FEERATE; bucketBoundary *= FEE_SPACING, bucketIndex++) {
        buckets.push_back(bucketBoundary);
        bucketMap[bucketBoundary] = bucketIndex;
    }
    buckets.push_back(INF_FEERATE);
    bucketMap[INF_FEERATE] = bucketIndex;
    assert(bucketMap.size() == buckets.size());

    feeStats = std::unique_ptr<TxConfirmStats>(new TxConfirmStats(buckets, bucketMap, MED_BLOCK_PERIODS, MED_DECAY, MED_SCALE));
    shortStats = std::unique_ptr<TxConfirmStats>(new TxConfirmStats(buckets, bucketMap, SHORT_BLOCK_PERIODS, SHORT_DECAY, SHORT_SCALE));
    longStats = std::unique_ptr<TxConfirmStats>(new TxConfirmStats(buckets, bucketMap, LONG_BLOCK_PERIODS, LONG_DECAY, LONG_SCALE));

    AutoFile est_file{fsbridge::fopen(m_estimation_filepath, "rb")};

    if (est_file.IsNull()) {
        LogPrintf("%s is not found. Continue anyway.\n", fs::PathToString(m_estimation_filepath));
        return;
    }

    std::chrono::hours file_age = GetFeeEstimatorFileAge();
    if (file_age > MAX_FILE_AGE && !read_stale_estimates) {
        LogPrintf("Fee estimation file %s too old (age=%lld > %lld hours) and will not be used to avoid serving stale estimates.\n", fs::PathToString(m_estimation_filepath), Ticks<std::chrono::hours>(file_age), Ticks<std::chrono::hours>(MAX_FILE_AGE));
        return;
    }

    if (!Read(est_file)) {
        LogPrintf("Failed to read fee estimates from %s. Continue anyway.\n", fs::PathToString(m_estimation_filepath));
    }
}